

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void AArch64_printInst(MCInst *MI,SStream *O,void *Info)

{
  byte bVar1;
  ushort uVar2;
  cs_struct *pcVar3;
  cs_detail *pcVar4;
  _Bool _Var5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint uVar8;
  uint uVar9;
  arm64_reg aVar10;
  MCOperand *pMVar11;
  MCOperand *pMVar12;
  MCOperand *pMVar13;
  MCOperand *pMVar14;
  int64_t iVar15;
  int64_t iVar16;
  ulong uVar17;
  int64_t iVar18;
  undefined *puVar19;
  uint8_t *puVar20;
  char *pcVar21;
  cs_insn *pcVar22;
  int iVar23;
  uint uVar24;
  char *pcVar25;
  uint val;
  int iVar26;
  char *AsmStrs;
  uint uVar27;
  uint16_t *RegAsmOffset_1;
  char *AsmStrs_1;
  int iVar28;
  uint16_t *RegAsmOffset;
  
  uVar8 = MCInst_getOpcode(MI);
  if (uVar8 == 0x7c4) {
    pMVar11 = MCInst_getOperand(MI,0);
    pMVar12 = MCInst_getOperand(MI,1);
    pMVar13 = MCInst_getOperand(MI,2);
    pMVar14 = MCInst_getOperand(MI,3);
    iVar15 = MCOperand_getImm(pMVar11);
    iVar16 = MCOperand_getImm(pMVar12);
    uVar17 = MCOperand_getImm(pMVar13);
    iVar18 = MCOperand_getImm(pMVar14);
    iVar26 = (int)iVar15;
    uVar27 = (uint)iVar18;
    uVar8 = uVar27;
    uVar9 = uVar27;
    if ((int)iVar16 == 8) {
      switch(uVar17 & 0xffffffff) {
      case 0:
        if (iVar26 != 4) goto switchD_001fc557_caseD_2;
        uVar24 = 0x1c3;
        if (uVar27 == 1) {
          iVar26 = 0xf;
          pcVar21 = "tlbi\tipas2e1is";
          uVar27 = 0;
        }
        else {
          if (uVar27 != 5) goto switchD_001fc557_caseD_2;
          iVar26 = 0x10;
          pcVar21 = "tlbi\tipas2le1is";
          uVar27 = 0;
        }
        break;
      default:
        goto switchD_001fc557_caseD_2;
      case 3:
        if (iVar26 == 6) {
          uVar24 = 0x1c3;
          if (uVar27 == 0) {
            iVar26 = 0xc;
            pcVar21 = "tlbi\talle3is";
LAB_001fe0a6:
            uVar24 = 0x1c3;
            goto LAB_001fdeae;
          }
          if (uVar27 == 5) {
            iVar26 = 0xe;
            pcVar21 = "tlbi\tvale3is";
            uVar27 = 0;
          }
          else {
            if (uVar27 != 1) goto switchD_001fc557_caseD_2;
            iVar26 = 0xd;
            pcVar21 = "tlbi\tvae3is";
            uVar27 = 0;
          }
        }
        else {
          if (iVar26 == 4) {
            if ((6 < uVar27) || ((0x73U >> (uVar27 & 0x1f) & 1) == 0))
            goto switchD_001fc557_caseD_2;
            uVar17 = (ulong)((uVar27 & 7) << 2);
            pcVar21 = &DAT_003b1e38 + *(int *)(&DAT_003b1e38 + uVar17);
            puVar19 = &DAT_003b1e54;
          }
          else {
            if (((iVar26 != 0) || (7 < uVar27)) || ((0xafU >> (uVar27 & 0x1f) & 1) == 0))
            goto switchD_001fc557_caseD_2;
            uVar17 = (ulong)((uVar27 & 7) << 2);
            pcVar21 = &DAT_003b1e18 + *(int *)(&DAT_003b1e18 + uVar17);
            puVar19 = &DAT_003b38a4;
          }
LAB_001fd61b:
          iVar26 = *(int *)(puVar19 + uVar17);
          uVar24 = 0x1c3;
          uVar27 = 0;
        }
        break;
      case 4:
        if (iVar26 != 4) goto switchD_001fc557_caseD_2;
        uVar24 = 0x1c3;
        if (uVar27 == 1) {
          iVar26 = 0x11;
          pcVar21 = "tlbi\tipas2e1";
          uVar27 = 0;
        }
        else {
          if (uVar27 != 5) goto switchD_001fc557_caseD_2;
          iVar26 = 0x12;
          pcVar21 = "tlbi\tipas2le1";
          uVar27 = 0;
        }
        break;
      case 7:
        if (iVar26 != 6) {
          if (iVar26 == 4) {
            if ((6 < uVar27) || ((0x73U >> (uVar27 & 0x1f) & 1) == 0))
            goto switchD_001fc557_caseD_2;
            uVar17 = (ulong)((uVar27 & 7) << 2);
            pcVar21 = &DAT_003b1e90 + *(int *)(&DAT_003b1e90 + uVar17);
            puVar19 = &DAT_003b1eac;
          }
          else {
            if (((iVar26 != 0) || (7 < uVar27)) || ((0xafU >> (uVar27 & 0x1f) & 1) == 0))
            goto switchD_001fc557_caseD_2;
            uVar17 = (ulong)((uVar27 & 7) << 2);
            pcVar21 = &DAT_003b1e70 + *(int *)(&DAT_003b1e70 + uVar17);
            puVar19 = &DAT_003b38c4;
          }
          goto LAB_001fd61b;
        }
        uVar24 = 0x1c3;
        if (uVar27 == 0) {
          iVar26 = 0x1e;
          pcVar21 = "tlbi\talle3";
          goto LAB_001fe0a6;
        }
        if (uVar27 == 5) {
          iVar26 = 0x20;
          pcVar21 = "tlbi\tvale3";
          uVar27 = 0;
        }
        else {
          if (uVar27 != 1) goto switchD_001fc557_caseD_2;
          iVar26 = 0x1f;
          pcVar21 = "tlbi\tvae3";
          uVar27 = 0;
        }
      }
LAB_001fdea4:
      uVar8 = 0;
LAB_001fdeab:
      uVar9 = 0;
    }
    else {
      if ((int)iVar16 != 7) {
switchD_001fc557_caseD_2:
        pcVar21 = printAliasInstr(MI,O,Info);
        if (pcVar21 == (char *)0x0) {
          printInstruction(MI,O,(MCRegisterInfo *)Info);
          return;
        }
        aVar10 = AArch64_map_insn(pcVar21);
        MCInst_setOpcodePub(MI,aVar10);
        (*cs_mem_free)(pcVar21);
        return;
      }
      switch((int)uVar17) {
      case 1:
        if (iVar26 != 0 || uVar27 != 0) goto switchD_001fc557_caseD_2;
        iVar26 = 0;
        uVar24 = 0x1c0;
        pcVar21 = "ic\tialluis";
        uVar27 = 1;
        goto LAB_001fdea4;
      default:
        goto switchD_001fc557_caseD_2;
      case 4:
        if (uVar27 != 1 || iVar26 != 3) goto switchD_001fc557_caseD_2;
        uVar9 = 1;
        pcVar21 = "dc\tzva";
        break;
      case 5:
        uVar24 = 0x1c0;
        if (iVar26 == 0 && uVar27 == 0) {
          uVar27 = 2;
          pcVar21 = "ic\tiallu";
        }
        else {
          if (uVar27 != 1 || iVar26 != 3) goto switchD_001fc557_caseD_2;
          uVar27 = 3;
          pcVar21 = "ic\tivau";
        }
        iVar26 = 0;
        uVar8 = 0;
        uVar9 = 0;
        goto LAB_001fdeae;
      case 6:
        if (uVar27 == 2 && iVar26 == 0) {
          uVar9 = 3;
          pcVar21 = "dc\tisw";
        }
        else {
          if (iVar26 != 0 || uVar27 != 1) goto switchD_001fc557_caseD_2;
          uVar9 = 2;
          pcVar21 = "dc\tivac";
        }
        break;
      case 8:
        if (iVar26 == 6) {
          uVar24 = 0x1c2;
          if (uVar27 == 0) {
            pcVar21 = "at\ts1e3r";
            iVar26 = 0;
            uVar8 = 10;
            goto LAB_001fdeae;
          }
          if (uVar27 != 1) goto switchD_001fc557_caseD_2;
          pcVar21 = "at\ts1e3w";
          uVar8 = 0xb;
        }
        else if (iVar26 == 4) {
          if ((7 < uVar27) || ((0xf3U >> (uVar27 & 0x1f) & 1) == 0)) goto switchD_001fc557_caseD_2;
          uVar8 = (uVar27 & 7) << 2;
          pcVar21 = &DAT_003b1df8 + *(int *)(&DAT_003b1df8 + uVar8);
          uVar8 = *(uint *)(&DAT_003b3884 + uVar8);
        }
        else {
          if ((iVar26 != 0) || (3 < uVar27)) goto switchD_001fc557_caseD_2;
          pcVar21 = &DAT_003b1de8 + *(int *)(&DAT_003b1de8 + (ulong)(uVar27 & 3) * 4);
        }
        uVar27 = 0;
        uVar24 = 0x1c2;
        iVar26 = 0;
        goto LAB_001fdeab;
      case 10:
        if (uVar27 == 1 && iVar26 == 3) {
          uVar9 = 4;
          pcVar21 = "dc\tcvac";
        }
        else {
          if (iVar26 != 0 || uVar27 != 2) goto switchD_001fc557_caseD_2;
          uVar9 = 5;
          pcVar21 = "dc\tcsw";
        }
        break;
      case 0xb:
        if (uVar27 != 1 || iVar26 != 3) goto switchD_001fc557_caseD_2;
        uVar9 = 6;
        pcVar21 = "dc\tcvau";
        break;
      case 0xe:
        if (uVar27 == 1 && iVar26 == 3) {
          uVar9 = 7;
          pcVar21 = "dc\tcivac";
        }
        else {
          if (iVar26 != 0 || uVar27 != 2) goto switchD_001fc557_caseD_2;
          uVar9 = 8;
          pcVar21 = "dc\tcisw";
        }
      }
      uVar27 = 0;
      uVar24 = 0x1c1;
      iVar26 = 0;
      uVar8 = 0;
    }
LAB_001fdeae:
    MCInst_setOpcodePub(MI,uVar24);
    SStream_concat0(O,pcVar21);
    pcVar3 = MI->csh;
    if (pcVar3->detail != CS_OPT_OFF) {
      uVar24 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar20 = AArch64_get_op_access(pcVar3,uVar24);
      uVar6 = '\0';
      if (puVar20[bVar1] != 0x80) {
        uVar6 = puVar20[bVar1];
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar20[0] = 'D';
      puVar20[1] = '\0';
      puVar20[2] = '\0';
      puVar20[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           uVar8 + uVar9 + iVar26 + uVar27;
      puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar20 = *puVar20 + '\x01';
    }
    pcVar21 = strstr(pcVar21,"all");
    if (pcVar21 != (char *)0x0) {
      return;
    }
    pMVar11 = MCInst_getOperand(MI,4);
    uVar8 = MCOperand_getReg(pMVar11);
    SStream_concat(O,", %s",getRegisterName_AsmStrsNoRegAltName +
                            *(ushort *)
                             (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2));
    pcVar3 = MI->csh;
    if (pcVar3->detail == CS_OPT_OFF) {
      return;
    }
    uVar27 = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar20 = AArch64_get_op_access(pcVar3,uVar27);
    uVar6 = '\0';
    if (puVar20[bVar1] != 0x80) {
      uVar6 = puVar20[bVar1];
    }
    pcVar4 = MI->flat_insn->detail;
    pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar4 = MI->flat_insn->detail;
    puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar20[0] = '\x01';
    puVar20[1] = '\0';
    puVar20[2] = '\0';
    puVar20[3] = '\0';
    pcVar4 = MI->flat_insn->detail;
    *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
LAB_001fe079:
    pcVar22 = MI->flat_insn;
  }
  else {
    uVar27 = uVar8 & 0xfffffffe;
    if ((uVar8 - 0x820 < 2) || (uVar8 - 0x502 < 2)) {
      pMVar11 = MCInst_getOperand(MI,0);
      pMVar12 = MCInst_getOperand(MI,1);
      pMVar13 = MCInst_getOperand(MI,2);
      pMVar14 = MCInst_getOperand(MI,3);
      _Var5 = MCOperand_isImm(pMVar13);
      if ((_Var5) &&
         ((iVar15 = MCOperand_getImm(pMVar13), iVar15 == 0 &&
          (_Var5 = MCOperand_isImm(pMVar14), _Var5)))) {
        iVar15 = MCOperand_getImm(pMVar14);
        if (iVar15 == 0x1f) {
          if (((uVar8 == 0x821) || (uVar8 == 0x503)) && (uVar27 == 0x502)) {
            pcVar21 = "sxtw";
            goto LAB_001fcfff;
          }
        }
        else {
          if (iVar15 == 0xf) {
            pcVar25 = "sxth";
            pcVar21 = "uxth";
          }
          else {
            if (iVar15 != 7) goto LAB_001fd1d6;
            pcVar25 = "sxtb";
            pcVar21 = "uxtb";
          }
          if (uVar27 == 0x502) {
            pcVar21 = pcVar25;
          }
          if (uVar27 == 0x502 || uVar8 != 0x821) {
LAB_001fcfff:
            uVar8 = MCOperand_getReg(pMVar11);
            uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2);
            uVar8 = MCOperand_getReg(pMVar12);
            uVar8 = getWRegFromXReg(uVar8);
            SStream_concat(O,"%s\t%s, %s",pcVar21,getRegisterName_AsmStrsNoRegAltName + uVar2,
                           getRegisterName_AsmStrsNoRegAltName +
                           *(ushort *)
                            (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2));
            pcVar3 = MI->csh;
            if (pcVar3->detail != CS_OPT_OFF) {
              uVar8 = MCInst_getOpcode(MI);
              bVar1 = MI->ac_idx;
              puVar20 = AArch64_get_op_access(pcVar3,uVar8);
              uVar6 = puVar20[bVar1];
              if (puVar20[bVar1] == 0x80) {
                uVar6 = '\0';
              }
              pcVar4 = MI->flat_insn->detail;
              pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
              MI->ac_idx = MI->ac_idx + '\x01';
              pcVar4 = MI->flat_insn->detail;
              puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
              puVar20[0] = '\x01';
              puVar20[1] = '\0';
              puVar20[2] = '\0';
              puVar20[3] = '\0';
              uVar8 = MCOperand_getReg(pMVar11);
              pcVar4 = MI->flat_insn->detail;
              *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
                   uVar8;
              puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
              *puVar20 = *puVar20 + '\x01';
              pcVar3 = MI->csh;
              uVar8 = MCInst_getOpcode(MI);
              bVar1 = MI->ac_idx;
              puVar20 = AArch64_get_op_access(pcVar3,uVar8);
              uVar6 = puVar20[bVar1];
              if (uVar6 == 0x80) {
                uVar6 = '\0';
              }
              pcVar4 = MI->flat_insn->detail;
              pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
              MI->ac_idx = MI->ac_idx + '\x01';
              pcVar4 = MI->flat_insn->detail;
              puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
              puVar20[0] = '\x01';
              puVar20[1] = '\0';
              puVar20[2] = '\0';
              puVar20[3] = '\0';
              uVar8 = MCOperand_getReg(pMVar12);
              uVar8 = getWRegFromXReg(uVar8);
              pcVar4 = MI->flat_insn->detail;
              *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
                   uVar8;
              puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
              *puVar20 = *puVar20 + '\x01';
            }
            aVar10 = AArch64_map_insn(pcVar21);
            MCInst_setOpcodePub(MI,aVar10);
            return;
          }
        }
      }
LAB_001fd1d6:
      _Var5 = MCOperand_isImm(pMVar13);
      if ((_Var5) && (_Var5 = MCOperand_isImm(pMVar14), _Var5)) {
        iVar15 = MCOperand_getImm(pMVar13);
        iVar16 = MCOperand_getImm(pMVar14);
        uVar9 = (uint)iVar16;
        val = (uint)iVar15;
        uVar24 = uVar9 + 1 ^ val;
        if (((uVar8 ^ 0x820) == 0 && uVar24 == 0) && uVar9 != 0x1f) {
          iVar26 = 0x1f;
LAB_001fd261:
          val = iVar26 - uVar9;
          pcVar21 = "lsl";
        }
        else {
          if ((uVar24 == 0 && (uVar8 ^ 0x821) == 0) && uVar9 != 0x3f) {
            iVar26 = 0x3f;
            goto LAB_001fd261;
          }
          pcVar21 = "lsr";
          if (((uVar8 ^ 0x820) != 0 || (uVar9 ^ 0x1f) != 0) &&
             ((uVar8 ^ 0x821) != 0 || (uVar9 ^ 0x3f) != 0)) {
            pcVar21 = "asr";
            if ((uVar8 != 0x502 || (uVar9 ^ 0x1f) != 0) && (uVar8 != 0x503 || (uVar9 ^ 0x3f) != 0))
            goto LAB_001fd695;
          }
        }
        uVar8 = MCOperand_getReg(pMVar11);
        uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2);
        uVar8 = MCOperand_getReg(pMVar12);
        SStream_concat(O,"%s\t%s, %s, ",pcVar21,getRegisterName_AsmStrsNoRegAltName + uVar2,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(ushort *)
                        (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2));
        printInt32Bang(O,val);
        aVar10 = AArch64_map_insn(pcVar21);
        MCInst_setOpcodePub(MI,aVar10);
        pcVar3 = MI->csh;
        if (pcVar3->detail == CS_OPT_OFF) {
          return;
        }
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar6 = puVar20[bVar1];
        if (puVar20[bVar1] == 0x80) {
          uVar6 = '\0';
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x01';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        uVar8 = MCOperand_getReg(pMVar11);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
        puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar20 = *puVar20 + '\x01';
        pcVar3 = MI->csh;
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar6 = puVar20[bVar1];
        if (uVar6 == 0x80) {
          uVar6 = '\0';
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x01';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        uVar8 = MCOperand_getReg(pMVar12);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
        puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar20 = *puVar20 + '\x01';
        pcVar3 = MI->csh;
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar6 = puVar20[bVar1];
        if (uVar6 == 0x80) {
          uVar6 = '\0';
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x02';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        pcVar4 = MI->flat_insn->detail;
        *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
             (long)(int)val;
        goto LAB_001fe079;
      }
LAB_001fd695:
      iVar15 = MCOperand_getImm(pMVar13);
      iVar16 = MCOperand_getImm(pMVar14);
      uVar9 = MCOperand_getReg(pMVar11);
      uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar9 - 1) * 2);
      uVar9 = MCOperand_getReg(pMVar12);
      if (iVar16 < iVar15) {
        pcVar21 = "ubfiz";
        if (uVar27 == 0x502) {
          pcVar21 = "sbfiz";
        }
        uVar6 = '\0';
        SStream_concat(O,"%s\t%s, %s, ",pcVar21,getRegisterName_AsmStrsNoRegAltName + uVar2,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(ushort *)
                        (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar9 - 1) * 2));
        iVar26 = (uint)(uVar8 == 0x503 || uVar8 == 0x821) * 0x20 + 0x20;
        iVar15 = MCOperand_getImm(pMVar13);
        printInt32Bang(O,iVar26 - (int)iVar15);
        SStream_concat0(O,", ");
        iVar15 = MCOperand_getImm(pMVar14);
        printInt32Bang(O,(int)iVar15 + 1);
        aVar10 = AArch64_map_insn(pcVar21);
        MCInst_setOpcodePub(MI,aVar10);
        pcVar3 = MI->csh;
        if (pcVar3->detail == CS_OPT_OFF) {
          return;
        }
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar7 = puVar20[bVar1];
        if (puVar20[bVar1] == 0x80) {
          uVar7 = uVar6;
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x01';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        uVar8 = MCOperand_getReg(pMVar11);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
        puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar20 = *puVar20 + '\x01';
        pcVar3 = MI->csh;
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar7 = puVar20[bVar1];
        if (puVar20[bVar1] == 0x80) {
          uVar7 = uVar6;
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x01';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        uVar8 = MCOperand_getReg(pMVar12);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
        puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar20 = *puVar20 + '\x01';
        pcVar3 = MI->csh;
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar7 = puVar20[bVar1];
        if (puVar20[bVar1] == 0x80) {
          uVar7 = uVar6;
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x02';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        iVar15 = MCOperand_getImm(pMVar13);
        pcVar4 = MI->flat_insn->detail;
        *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
             (long)(iVar26 - (int)iVar15);
        puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar20 = *puVar20 + '\x01';
        pcVar3 = MI->csh;
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar7 = puVar20[bVar1];
        if (puVar20[bVar1] == 0x80) {
          uVar7 = uVar6;
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x02';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        iVar15 = MCOperand_getImm(pMVar14);
        pcVar4 = MI->flat_insn->detail;
        *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
             iVar15 + 1;
        pcVar22 = MI->flat_insn;
        goto LAB_001fe080;
      }
      pcVar21 = "ubfx";
      if (uVar27 == 0x502) {
        pcVar21 = "sbfx";
      }
      uVar6 = '\0';
      SStream_concat(O,"%s\t%s, %s, ",pcVar21,getRegisterName_AsmStrsNoRegAltName + uVar2,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar9 - 1) * 2))
      ;
      iVar15 = MCOperand_getImm(pMVar13);
      printInt32Bang(O,(int32_t)iVar15);
      SStream_concat0(O,", ");
      iVar15 = MCOperand_getImm(pMVar14);
      iVar16 = MCOperand_getImm(pMVar13);
      printInt32Bang(O,((int)iVar15 - (int)iVar16) + 1);
      aVar10 = AArch64_map_insn(pcVar21);
      MCInst_setOpcodePub(MI,aVar10);
      pcVar3 = MI->csh;
      if (pcVar3->detail == CS_OPT_OFF) {
        return;
      }
      uVar8 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar20 = AArch64_get_op_access(pcVar3,uVar8);
      uVar7 = puVar20[bVar1];
      if (puVar20[bVar1] == 0x80) {
        uVar7 = uVar6;
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar20[0] = '\x01';
      puVar20[1] = '\0';
      puVar20[2] = '\0';
      puVar20[3] = '\0';
      uVar8 = MCOperand_getReg(pMVar11);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
      puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar20 = *puVar20 + '\x01';
      pcVar3 = MI->csh;
      uVar8 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar20 = AArch64_get_op_access(pcVar3,uVar8);
      uVar7 = puVar20[bVar1];
      if (puVar20[bVar1] == 0x80) {
        uVar7 = uVar6;
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar20[0] = '\x01';
      puVar20[1] = '\0';
      puVar20[2] = '\0';
      puVar20[3] = '\0';
      uVar8 = MCOperand_getReg(pMVar12);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
      puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar20 = *puVar20 + '\x01';
      pcVar3 = MI->csh;
      uVar8 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar20 = AArch64_get_op_access(pcVar3,uVar8);
      uVar7 = puVar20[bVar1];
      if (puVar20[bVar1] == 0x80) {
        uVar7 = uVar6;
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar20[0] = '\x02';
      puVar20[1] = '\0';
      puVar20[2] = '\0';
      puVar20[3] = '\0';
      iVar15 = MCOperand_getImm(pMVar13);
      pcVar4 = MI->flat_insn->detail;
      *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = iVar15;
      puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar20 = *puVar20 + '\x01';
      pcVar3 = MI->csh;
      uVar8 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar20 = AArch64_get_op_access(pcVar3,uVar8);
      uVar7 = puVar20[bVar1];
      if (puVar20[bVar1] == 0x80) {
        uVar7 = uVar6;
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar20[0] = '\x02';
      puVar20[1] = '\0';
      puVar20[2] = '\0';
      puVar20[3] = '\0';
      iVar15 = MCOperand_getImm(pMVar14);
      iVar16 = MCOperand_getImm(pMVar13);
      pcVar4 = MI->flat_insn->detail;
      *(int64_t *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           (iVar15 - iVar16) + 1;
    }
    else {
      if (uVar27 != 0x68) goto switchD_001fc557_caseD_2;
      pMVar11 = MCInst_getOperand(MI,0);
      pMVar12 = MCInst_getOperand(MI,2);
      pMVar13 = MCInst_getOperand(MI,3);
      iVar15 = MCOperand_getImm(pMVar13);
      pMVar13 = MCInst_getOperand(MI,4);
      iVar16 = MCOperand_getImm(pMVar13);
      iVar28 = (int)iVar16;
      iVar26 = (int)iVar15;
      if (iVar26 <= iVar28) {
        iVar28 = (iVar28 - iVar26) + 1;
        uVar8 = MCOperand_getReg(pMVar11);
        uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2);
        uVar8 = MCOperand_getReg(pMVar12);
        SStream_concat(O,"bfxil\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar2,
                       getRegisterName_AsmStrsNoRegAltName +
                       *(ushort *)
                        (getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2));
        printInt32Bang(O,iVar26);
        SStream_concat0(O,", ");
        printInt32Bang(O,iVar28);
        aVar10 = AArch64_map_insn("bfxil");
        MCInst_setOpcodePub(MI,aVar10);
        pcVar3 = MI->csh;
        if (pcVar3->detail == CS_OPT_OFF) {
          return;
        }
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar6 = puVar20[bVar1];
        if (puVar20[bVar1] == 0x80) {
          uVar6 = '\0';
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x01';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        uVar8 = MCOperand_getReg(pMVar11);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
        puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar20 = *puVar20 + '\x01';
        pcVar3 = MI->csh;
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar6 = puVar20[bVar1];
        if (puVar20[bVar1] == 0x80) {
          uVar6 = '\0';
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x01';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        uVar8 = MCOperand_getReg(pMVar12);
        pcVar4 = MI->flat_insn->detail;
        *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
        puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar20 = *puVar20 + '\x01';
        pcVar3 = MI->csh;
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar6 = puVar20[bVar1];
        if (puVar20[bVar1] == 0x80) {
          uVar6 = '\0';
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x02';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        pcVar4 = MI->flat_insn->detail;
        *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
             (long)iVar26;
        puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar20 = *puVar20 + '\x01';
        pcVar3 = MI->csh;
        uVar8 = MCInst_getOpcode(MI);
        bVar1 = MI->ac_idx;
        puVar20 = AArch64_get_op_access(pcVar3,uVar8);
        uVar6 = puVar20[bVar1];
        if (puVar20[bVar1] == 0x80) {
          uVar6 = '\0';
        }
        pcVar4 = MI->flat_insn->detail;
        pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar4 = MI->flat_insn->detail;
        puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar20[0] = '\x02';
        puVar20[1] = '\0';
        puVar20[2] = '\0';
        puVar20[3] = '\0';
        pcVar4 = MI->flat_insn->detail;
        *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
             (long)iVar28;
        pcVar22 = MI->flat_insn;
        goto LAB_001fe080;
      }
      iVar23 = (uint)(uVar8 == 0x69) * 0x20 + 0x20;
      iVar23 = (iVar23 - iVar26) % iVar23;
      uVar8 = MCOperand_getReg(pMVar11);
      uVar2 = *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2);
      uVar8 = MCOperand_getReg(pMVar12);
      SStream_concat(O,"bfi\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar2,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(ushort *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar8 - 1) * 2))
      ;
      printInt32Bang(O,iVar23);
      SStream_concat0(O,", ");
      printInt32Bang(O,iVar28 + 1);
      aVar10 = AArch64_map_insn("bfi");
      MCInst_setOpcodePub(MI,aVar10);
      pcVar3 = MI->csh;
      if (pcVar3->detail == CS_OPT_OFF) {
        return;
      }
      uVar8 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar20 = AArch64_get_op_access(pcVar3,uVar8);
      uVar6 = puVar20[bVar1];
      if (puVar20[bVar1] == 0x80) {
        uVar6 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar20[0] = '\x01';
      puVar20[1] = '\0';
      puVar20[2] = '\0';
      puVar20[3] = '\0';
      uVar8 = MCOperand_getReg(pMVar11);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
      puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar20 = *puVar20 + '\x01';
      pcVar3 = MI->csh;
      uVar8 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar20 = AArch64_get_op_access(pcVar3,uVar8);
      uVar6 = puVar20[bVar1];
      if (puVar20[bVar1] == 0x80) {
        uVar6 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar20[0] = '\x01';
      puVar20[1] = '\0';
      puVar20[2] = '\0';
      puVar20[3] = '\0';
      uVar8 = MCOperand_getReg(pMVar12);
      pcVar4 = MI->flat_insn->detail;
      *(uint *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar8;
      puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar20 = *puVar20 + '\x01';
      pcVar3 = MI->csh;
      uVar8 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar20 = AArch64_get_op_access(pcVar3,uVar8);
      uVar6 = puVar20[bVar1];
      if (uVar6 == 0x80) {
        uVar6 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar20[0] = '\x02';
      puVar20[1] = '\0';
      puVar20[2] = '\0';
      puVar20[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           (long)iVar23;
      puVar20 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar20 = *puVar20 + '\x01';
      pcVar3 = MI->csh;
      uVar8 = MCInst_getOpcode(MI);
      bVar1 = MI->ac_idx;
      puVar20 = AArch64_get_op_access(pcVar3,uVar8);
      uVar6 = puVar20[bVar1];
      if (uVar6 == 0x80) {
        uVar6 = '\0';
      }
      pcVar4 = MI->flat_insn->detail;
      pcVar4->groups[(ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar6;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar4 = MI->flat_insn->detail;
      puVar20 = pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar20[0] = '\x02';
      puVar20[1] = '\0';
      puVar20[2] = '\0';
      puVar20[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      *(long *)(pcVar4->groups + (ulong)(pcVar4->field_6).x86.opcode[2] * 0x38 + 0x35) =
           (long)(iVar28 + 1);
    }
    pcVar22 = MI->flat_insn;
  }
LAB_001fe080:
  puVar20 = (pcVar22->detail->field_6).x86.opcode + 2;
  *puVar20 = *puVar20 + '\x01';
  return;
}

Assistant:

void AArch64_printInst(MCInst *MI, SStream *O, void *Info)
{
	// Check for special encodings and print the canonical alias instead.
	unsigned Opcode = MCInst_getOpcode(MI);
	int LSB;
	int Width;
	char *mnem;

	if (Opcode == AArch64_SYSxt && printSysAlias(MI, O))
		return;

	// SBFM/UBFM should print to a nicer aliased form if possible.
	if (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri ||
			Opcode == AArch64_UBFMXri || Opcode == AArch64_UBFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0);
		MCOperand *Op1 = MCInst_getOperand(MI, 1);
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		MCOperand *Op3 = MCInst_getOperand(MI, 3);

		bool IsSigned = (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri);
		bool Is64Bit = (Opcode == AArch64_SBFMXri || Opcode == AArch64_UBFMXri);

		if (MCOperand_isImm(Op2) && MCOperand_getImm(Op2) == 0 && MCOperand_isImm(Op3)) {
			const char *AsmMnemonic = NULL;

			switch (MCOperand_getImm(Op3)) {
				default:
					break;
				case 7:
					if (IsSigned)
						AsmMnemonic = "sxtb";
					else if (!Is64Bit)
						AsmMnemonic = "uxtb";
					break;
				case 15:
					if (IsSigned)
						AsmMnemonic = "sxth";
					else if (!Is64Bit)
						AsmMnemonic = "uxth";
					break;
				case 31:
					// *xtw is only valid for signed 64-bit operations.
					if (Is64Bit && IsSigned)
						AsmMnemonic = "sxtw";
					break;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(getWRegFromXReg(MCOperand_getReg(Op1)), AArch64_NoRegAltName));

				if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
					uint8_t access;
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = getWRegFromXReg(MCOperand_getReg(Op1));
					MI->flat_insn->detail->arm64.op_count++;
				}

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				return;
			}
		}

		// All immediate shifts are aliases, implemented using the Bitfield
		// instruction. In all cases the immediate shift amount shift must be in
		// the range 0 to (reg.size -1).
		if (MCOperand_isImm(Op2) && MCOperand_isImm(Op3)) {
			const char *AsmMnemonic = NULL;
			int shift = 0;
			int immr = (int)MCOperand_getImm(Op2);
			int imms = (int)MCOperand_getImm(Op3);

			if (Opcode == AArch64_UBFMWri && imms != 0x1F && ((imms + 1) == immr)) {
				AsmMnemonic = "lsl";
				shift = 31 - imms;
			} else if (Opcode == AArch64_UBFMXri && imms != 0x3f &&
					((imms + 1 == immr))) {
				AsmMnemonic = "lsl";
				shift = 63 - imms;
			} else if (Opcode == AArch64_UBFMWri && imms == 0x1f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_UBFMXri && imms == 0x3f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMWri && imms == 0x1f) {
				AsmMnemonic = "asr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMXri && imms == 0x3f) {
				AsmMnemonic = "asr";
				shift = immr;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s, ", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));

				printInt32Bang(O, shift);

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
					uint8_t access;
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
					MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
					access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
					MI->ac_idx++;
#endif
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = shift;
					MI->flat_insn->detail->arm64.op_count++;
				}

				return;
			}
		}

		// SBFIZ/UBFIZ aliases
		if (MCOperand_getImm(Op2) > MCOperand_getImm(Op3)) {
			SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfiz" : "ubfiz"),
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
			printInt32Bang(O, (int)((Is64Bit ? 64 : 32) - MCOperand_getImm(Op2)));
			SStream_concat0(O, ", ");
			printInt32Bang(O, (int)MCOperand_getImm(Op3) + 1);

			MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfiz" : "ubfiz"));

			if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (Is64Bit ? 64 : 32) - (int)MCOperand_getImm(Op2);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op3) + 1;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		// Otherwise SBFX/UBFX is the preferred form
		SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfx" : "ubfx"),
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
		printInt32Bang(O, (int)MCOperand_getImm(Op2));
		SStream_concat0(O, ", ");
		printInt32Bang(O, (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1);

		MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfx" : "ubfx"));

		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op2);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = MCOperand_getImm(Op3) - MCOperand_getImm(Op2) + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	if (Opcode == AArch64_BFMXri || Opcode == AArch64_BFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0); // Op1 == Op0
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		int ImmR = (int)MCOperand_getImm(MCInst_getOperand(MI, 3));
		int ImmS = (int)MCOperand_getImm(MCInst_getOperand(MI, 4));

		// BFI alias
		if (ImmS < ImmR) {
			int BitWidth = Opcode == AArch64_BFMXri ? 64 : 32;
			LSB = (BitWidth - ImmR) % BitWidth;
			Width = ImmS + 1;

			SStream_concat(O, "bfi\t%s, %s, ",
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
			printInt32Bang(O, LSB);
			SStream_concat0(O, ", ");
			printInt32Bang(O, Width);
			MCInst_setOpcodePub(MI, AArch64_map_insn("bfi"));

			if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
				MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		LSB = ImmR;
		Width = ImmS - ImmR + 1;
		// Otherwise BFXIL the preferred form
		SStream_concat(O, "bfxil\t%s, %s, ",
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
		printInt32Bang(O, LSB);
		SStream_concat0(O, ", ");
		printInt32Bang(O, Width);
		MCInst_setOpcodePub(MI, AArch64_map_insn("bfxil"));

		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
			MI->flat_insn->detail->arm64.op_count++;
#ifndef CAPSTONE_DIET
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		MCInst_setOpcodePub(MI, AArch64_map_insn(mnem));
		cs_mem_free(mnem);
	} else {
		printInstruction(MI, O, Info);
	}
}